

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::RollupOutput::SetDisassembly(RollupOutput *this,string_view disassembly)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30 [32];
  
  local_40._M_str = disassembly._M_str;
  local_40._M_len = disassembly._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_30,&local_40,&local_41);
  std::__cxx11::string::operator=((string *)&this->disassembly_,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SetDisassembly(std::string_view disassembly) {
    disassembly_ = std::string(disassembly);
  }